

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall muduo::Logger::Impl::finish(Impl *this)

{
  LogStream *in_RDI;
  LogStream *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  LogStream::operator<<(unaff_retaddr,(char *)in_RDI);
  operator<<(in_RDI,(SourceFile *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  LogStream::operator<<(in_RDI,(char)((uint)in_stack_ffffffffffffffec >> 0x18));
  LogStream::operator<<(in_RDI,in_stack_ffffffffffffffec);
  LogStream::operator<<(in_RDI,(char)((uint)in_stack_ffffffffffffffec >> 0x18));
  return;
}

Assistant:

void Logger::Impl::finish()
{
  stream_ << " - " << basename_ << ':' << line_ << '\n';
}